

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode libcurl_generate_mime_part(CURL *curl,GlobalConfig *config,tool_mime *part,int mimeno)

{
  ulong uVar1;
  uint uVar2;
  CURLcode CVar3;
  ulong in_RAX;
  char *__ptr;
  tool_mime *toolmime;
  GlobalConfig *config_00;
  char *str;
  CURLcode CVar4;
  int submimeno;
  int slistno;
  ulong local_38;
  
  config_00 = (GlobalConfig *)((ulong)config & 0xffffffff);
  local_38 = in_RAX & 0xffffffff00000000;
  str = *(char **)(curl + 0x28);
  if ((*(CURL **)(curl + 0x10) != (CURL *)0x0) &&
     (CVar3 = libcurl_generate_mime_part(*(CURL **)(curl + 0x10),config_00,part,mimeno),
     CVar3 != CURLE_OK)) {
    return CVar3;
  }
  CVar4 = CURLE_OK;
  CVar3 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",config_00,config_00);
  if (CVar3 != CURLE_OK) goto LAB_0011b75f;
  switch(*(undefined4 *)curl) {
  case 1:
    CVar4 = libcurl_generate_mime
                      (curl,(GlobalConfig *)&stack0xffffffffffffffc8,toolmime,
                       (int *)&switchD_0011b783::switchdataD_00124fc8);
    uVar1 = local_38;
    if (CVar4 != CURLE_OK) goto switchD_0011b783_default;
    __ptr = (char *)0x0;
    CVar3 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",config_00,
                         local_38 & 0xffffffff);
    if (CVar3 != CURLE_OK) goto LAB_0011bab2;
    CVar3 = easysrc_addf(&easysrc_code,"mime%d = NULL;",uVar1 & 0xffffffff);
    goto LAB_0011b91e;
  case 2:
    __ptr = c_escape(*(char **)(curl + 0x18),-1);
    CVar4 = CURLE_OK;
    if (__ptr != (char *)0x0) {
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                           config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011bab2;
      goto LAB_0011b817;
    }
    break;
  case 3:
  case 4:
    __ptr = c_escape(*(char **)(curl + 0x18),-1);
    if (__ptr != (char *)0x0) {
      CVar4 = CURLE_OK;
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                           (ulong)config & 0xffffffff,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011bab2;
      if (str == (char *)0x0 && *(int *)curl == 4) {
        CVar4 = CURLE_OK;
        CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",
                             (ulong)config & 0xffffffff);
        if (CVar3 != CURLE_OK) goto LAB_0011bab2;
        str = (char *)0x0;
      }
      goto LAB_0011b817;
    }
    break;
  case 5:
    if (str == (char *)0x0) {
      str = "-";
    }
  case 6:
    __ptr = (char *)0x0;
    CVar3 = easysrc_addf(&easysrc_code,
                         "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                         (ulong)config & 0xffffffff);
    if (CVar3 != CURLE_OK) goto LAB_0011bab2;
    CVar3 = easysrc_add(&easysrc_code,"                  (curl_seek_callback) fseek, NULL, stdin);")
    ;
LAB_0011b91e:
    __ptr = (char *)0x0;
    if (CVar3 != CURLE_OK) goto LAB_0011bab2;
    CVar4 = CURLE_OK;
LAB_0011b817:
    if (CVar4 == CURLE_OK) {
      if (*(long *)(curl + 0x38) == 0) {
        CVar4 = CURLE_OK;
      }
      else {
        free(__ptr);
        __ptr = c_escape(*(char **)(curl + 0x38),-1);
        CVar4 = CURLE_OK;
        if (__ptr == (char *)0x0) break;
        CVar3 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",config_00,__ptr);
        if (CVar3 != CURLE_OK) goto LAB_0011bab2;
      }
    }
    if (str != (char *)0x0 && CVar4 == CURLE_OK) {
      free(__ptr);
      __ptr = c_escape(str,-1);
      CVar4 = CURLE_OK;
      if (__ptr == (char *)0x0) break;
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011bab2;
    }
    if (CVar4 == CURLE_OK) {
      if (*(long *)(curl + 0x20) == 0) {
        CVar4 = CURLE_OK;
      }
      else {
        free(__ptr);
        __ptr = c_escape(*(char **)(curl + 0x20),-1);
        CVar4 = CURLE_OK;
        if (__ptr == (char *)0x0) break;
        CVar3 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",config_00,__ptr);
        if (CVar3 != CURLE_OK) goto LAB_0011bab2;
      }
    }
    CVar3 = CVar4;
    if (CVar4 != CURLE_OK) goto LAB_0011bab2;
    if (*(long *)(curl + 0x30) != 0) {
      free(__ptr);
      __ptr = c_escape(*(char **)(curl + 0x30),-1);
      if (__ptr == (char *)0x0) break;
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011bab2;
    }
    if (*(curl_slist **)(curl + 0x40) == (curl_slist *)0x0) {
      CVar3 = CURLE_OK;
    }
    else {
      CVar3 = libcurl_generate_slist
                        (*(curl_slist **)(curl + 0x40),(int *)((long)register0x00000020 + -0x34));
      if (CVar3 == CURLE_OK) {
        uVar2 = local_38._4_4_;
        CVar3 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, 1);",config_00,
                             (ulong)local_38._4_4_);
        if (CVar3 == CURLE_OK) {
          CVar3 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)uVar2);
        }
      }
    }
    goto LAB_0011bab2;
  default:
switchD_0011b783_default:
    __ptr = (char *)0x0;
    goto LAB_0011b817;
  }
  CVar3 = CURLE_OUT_OF_MEMORY;
LAB_0011b75f:
  __ptr = (char *)0x0;
LAB_0011bab2:
  free(__ptr);
  return CVar3;
}

Assistant:

static CURLcode libcurl_generate_mime_part(CURL *curl,
                                           struct GlobalConfig *config,
                                           struct tool_mime *part,
                                           int mimeno)
{
  CURLcode ret = CURLE_OK;
  int submimeno = 0;
  char *escaped = NULL;
  const char *data = NULL;
  const char *filename = part->filename;

  /* Parts are linked in reverse order. */
  if(part->prev) {
    ret = libcurl_generate_mime_part(curl, config, part->prev, mimeno);
    if(ret)
      return ret;
  }

  /* Create the part. */
  CODE2("part%d = curl_mime_addpart(mime%d);", mimeno, mimeno);

  switch(part->kind) {
  case TOOLMIME_PARTS:
    ret = libcurl_generate_mime(curl, config, part, &submimeno);
    if(!ret) {
      CODE2("curl_mime_subparts(part%d, mime%d);", mimeno, submimeno);
      CODE1("mime%d = NULL;", submimeno);   /* Avoid freeing in CLEAN. */
    }
    break;

  case TOOLMIME_DATA:
#ifdef CURL_DOES_CONVERSIONS
    /* Data will be set in ASCII, thus issue a comment with clear text. */
    escaped = c_escape(part->data, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE1("/* \"%s\" */", escaped);

    /* Our data is always textual: convert it to ASCII. */
    {
      size_t size = strlen(part->data);
      char *cp = malloc(size + 1);

      NULL_CHECK(cp);
      memcpy(cp, part->data, size + 1);
      ret = convert_to_network(cp, size);
      data = cp;
    }
#else
    data = part->data;
#endif
    if(!ret) {
      Curl_safefree(escaped);
      escaped = c_escape(data, ZERO_TERMINATED);
      NULL_CHECK(escaped);
      CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                            mimeno, escaped);
    }
    break;

  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA:
    escaped = c_escape(part->data, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filedata(part%d, \"%s\");", mimeno, escaped);
    if(part->kind == TOOLMIME_FILEDATA && !filename) {
      CODE1("curl_mime_filename(part%d, NULL);", mimeno);
    }
    break;

  case TOOLMIME_STDIN:
    if(!filename)
      filename = "-";
    /* FALLTHROUGH */
  case TOOLMIME_STDINDATA:
    /* Can only be reading stdin in the current context. */
    CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
          mimeno);
    CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
    break;
  default:
    /* Other cases not possible in this context. */
    break;
  }

  if(!ret && part->encoder) {
    Curl_safefree(escaped);
    escaped = c_escape(part->encoder, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_encoder(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && filename) {
    Curl_safefree(escaped);
    escaped = c_escape(filename, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filename(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->name) {
    Curl_safefree(escaped);
    escaped = c_escape(part->name, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_name(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->type) {
    Curl_safefree(escaped);
    escaped = c_escape(part->type, ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_type(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->headers) {
    int slistno;

    ret = libcurl_generate_slist(part->headers, &slistno);
    if(!ret) {
      CODE2("curl_mime_headers(part%d, slist%d, 1);", mimeno, slistno);
      CODE1("slist%d = NULL;", slistno); /* Prevent CLEANing. */
    }
  }

nomem:
#ifdef CURL_DOES_CONVERSIONS
  if(data)
    free((char *) data);
#endif

  Curl_safefree(escaped);
  return ret;
}